

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreTemplate.cc
# Opt level: O2

uint8_t * __thiscall PowerCore::fetchBlock(PowerCore *this,uint32_t blockAddr)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  bool bVar9;
  uint32_t uVar10;
  iterator iVar11;
  uchar *puVar12;
  ostream *poVar13;
  byte bVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  undefined2 uVar36;
  uint uVar37;
  uint32_t addr;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>,_bool>
  pVar45;
  anon_class_8_1_a7b1b3ad allocOpcode;
  uint32_t blockAddr_local;
  void **opcodes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uint uVar3;
  
  blockAddr_local = blockAddr;
  iVar11 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->blocks)._M_h,&blockAddr_local);
  if (iVar11.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(uint8_t **)
            ((long)iVar11.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                   ._M_cur + 0x10);
  }
  allocOpcode.block = &block;
  block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->getNextBreakpoint == (_func_uint32_t_uint32_t *)0x0) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = (*this->getNextBreakpoint)(blockAddr_local);
  }
  interpret2(this,&opcodes);
  addr = blockAddr_local;
LAB_00109521:
  if (addr == uVar10) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    *(void **)puVar12 = opcodes[-1];
    *(uint32_t *)(puVar12 + 8) = addr;
    uVar10 = (*this->getNextBreakpoint)(addr + 4);
  }
  uVar17 = *(uint *)((long)this->memoryBases[addr >> 0x1e] + (ulong)addr);
  uVar29 = uVar17 >> 0x18;
  uVar27 = (uVar17 & 0xff0000) >> 8;
  uVar2 = uVar29 | uVar27;
  uVar4 = (uVar17 & 0xff00) << 8;
  uVar3 = uVar2 | uVar4;
  uVar31 = uVar17 << 0x18;
  uVar37 = uVar3 | uVar31;
  uVar16 = uVar37 & 0xfc0007ff;
  bVar19 = (byte)((uVar17 & 0xff00) >> 8);
  if (uVar16 == 0x7c000014) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[7];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000015) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[5];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000114) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0xb];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000115) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[9];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000214) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[3];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000215) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[1];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000414) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[4];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000415) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[6];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000514) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[8];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000515) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[10];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000614) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = *opcodes;
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000615) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[2];
    goto LAB_00109814;
  }
  if (uVar16 == 0x7c000314) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0xb);
    bVar35 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0xf];
    goto LAB_0010d734;
  }
  if (uVar16 == 0x7c000315) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0xb);
    bVar35 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0xd];
    goto LAB_0010d734;
  }
  if (uVar16 == 0x7c000714) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0xb);
    bVar35 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0xc];
    goto LAB_0010d734;
  }
  if (uVar16 == 0x7c000715) {
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0xb);
    bVar35 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0xe];
    goto LAB_0010d734;
  }
  uVar36 = (undefined2)uVar2;
  switch(uVar37 + 0xd0000000 >> 0x1a) {
  case 0:
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0x13];
    break;
  case 1:
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0x12];
    break;
  case 2:
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0x11];
    break;
  case 3:
    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
    bVar14 = (byte)(uVar37 >> 0x15);
    pvVar18 = opcodes[0x10];
    break;
  default:
    uVar21 = uVar37 & 0xfc00ffff;
    bVar14 = bVar19;
    if (uVar21 == 0x7c000194) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1f];
LAB_00109a8f:
      *(void **)puVar12 = pvVar18;
      bVar19 = bVar19 & 0x1f;
LAB_00109a96:
      puVar12[8] = bVar19;
LAB_00109a9a:
      bVar14 = bVar14 & 0x1f;
LAB_00109a9d:
      puVar12[9] = bVar14;
      goto LAB_0010982b;
    }
    if (uVar21 == 0x7c000195) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1d];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c0001d4) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x17];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c0001d5) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x15];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c000594) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1c];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c000595) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1e];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c0005d4) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x14];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c0005d5) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar19 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x16];
      goto LAB_00109a8f;
    }
    if (uVar21 == 0x7c0003d4) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1b];
      goto LAB_0010d801;
    }
    if (uVar21 == 0x7c0003d5) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x19];
      goto LAB_0010d801;
    }
    if (uVar21 == 0x7c0007d4) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x18];
      goto LAB_0010d801;
    }
    if (uVar21 == 0x7c0007d5) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x1a];
      goto LAB_0010d801;
    }
    if (uVar16 == 0x7c000038) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x21];
      goto LAB_00109814;
    }
    if (uVar16 == 0x7c000079) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x22];
      goto LAB_00109814;
    }
    if (uVar16 == 0x7c000078) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x23];
      goto LAB_00109814;
    }
    if (uVar16 == 0x7c000039) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x20];
      goto LAB_00109814;
    }
    uVar8 = uVar31 & 0xfc000000;
    if (uVar8 == 0x70000000) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x25];
      break;
    }
    if (uVar8 == 0x74000000) {
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x24];
      break;
    }
    uVar23 = uVar37 & 0xfc000003;
    switch(uVar23) {
    case 0x24000000:
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x35];
      break;
    case 0x24000001:
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x33];
      break;
    case 0x24000002:
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x32];
      break;
    case 0x24000003:
      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
      bVar14 = (byte)(uVar37 >> 0x15);
      pvVar18 = opcodes[0x34];
      break;
    default:
      switch(uVar23) {
      case 0x40000000:
        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
        bVar14 = (byte)(uVar37 >> 0x15);
        pvVar18 = opcodes[0x31];
        break;
      case 0x40000001:
        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
        bVar14 = (byte)(uVar37 >> 0x15);
        pvVar18 = opcodes[0x2f];
        break;
      case 0x40000002:
        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
        bVar14 = (byte)(uVar37 >> 0x15);
        pvVar18 = opcodes[0x2e];
        break;
      case 0x40000003:
        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
        bVar14 = (byte)(uVar37 >> 0x15);
        pvVar18 = opcodes[0x30];
        break;
      default:
        switch(uVar23) {
        case 0x48000000:
          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
          uVar17 = uVar37 >> 2 & 0xffffff;
          pvVar18 = opcodes[0x29];
          break;
        case 0x48000001:
          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
          uVar17 = uVar37 >> 2 & 0xffffff;
          pvVar18 = opcodes[0x27];
          break;
        case 0x48000002:
          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
          uVar17 = uVar37 >> 2 & 0xffffff;
          pvVar18 = opcodes[0x26];
          break;
        case 0x48000003:
          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
          uVar17 = uVar37 >> 2 & 0xffffff;
          pvVar18 = opcodes[0x28];
          break;
        default:
          switch(uVar23) {
          case 0x58000000:
            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
            uVar17 = uVar37 >> 2 & 0xffffff;
            pvVar18 = opcodes[0x2d];
            break;
          case 0x58000001:
            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
            uVar17 = uVar37 >> 2 & 0xffffff;
            pvVar18 = opcodes[0x2b];
            break;
          case 0x58000002:
            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
            uVar17 = uVar37 >> 2 & 0xffffff;
            pvVar18 = opcodes[0x2a];
            break;
          case 0x58000003:
            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
            uVar17 = uVar37 >> 2 & 0xffffff;
            pvVar18 = opcodes[0x2c];
            break;
          default:
            switch(uVar21) {
            case 0x4c000020:
              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
              bVar14 = (byte)(uVar37 >> 0x15);
              pvVar18 = opcodes[0x3b];
              break;
            case 0x4c000021:
              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
              bVar14 = (byte)(uVar37 >> 0x15);
              pvVar18 = opcodes[0x3a];
              break;
            case 0x4c000022:
              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
              bVar14 = (byte)(uVar37 >> 0x15);
              pvVar18 = opcodes[0x3d];
              break;
            case 0x4c000023:
              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
              bVar14 = (byte)(uVar37 >> 0x15);
              pvVar18 = opcodes[0x3c];
              break;
            default:
              switch(uVar21) {
              case 0x4c000420:
                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                bVar14 = (byte)(uVar37 >> 0x15);
                pvVar18 = opcodes[0x37];
                break;
              case 0x4c000421:
                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                bVar14 = (byte)(uVar37 >> 0x15);
                pvVar18 = opcodes[0x36];
                break;
              case 0x4c000422:
                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                bVar14 = (byte)(uVar37 >> 0x15);
                pvVar18 = opcodes[0x39];
                break;
              case 0x4c000423:
                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                bVar14 = (byte)(uVar37 >> 0x15);
                pvVar18 = opcodes[0x38];
                break;
              default:
                uVar23 = uVar37 & 0xfc6007ff;
                if (uVar23 == 0x7c000000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x3f];
LAB_00109c41:
                  *(void **)puVar12 = pvVar18;
                  puVar12[10] = bVar14 & 7;
                  bVar14 = (byte)(uVar37 >> 0xb);
LAB_00109c4c:
                  bVar19 = bVar19 & 0x1f;
LAB_00109c4f:
                  puVar12[8] = bVar19;
                  goto LAB_00109a9a;
                }
                if (uVar23 == 0x7c200000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x3e];
                  goto LAB_00109c41;
                }
                uVar26 = uVar37 & 0xfc600000;
                if (uVar26 == 0x2c000000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x41];
LAB_00109cb1:
                  *(void **)puVar12 = pvVar18;
                  puVar12[0xb] = bVar14 & 7;
                  puVar12[10] = bVar19 & 0x1f;
                  goto LAB_001098a1;
                }
                if (uVar26 == 0x2c200000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x40];
                  goto LAB_00109cb1;
                }
                if (uVar23 == 0x7c000040) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x43];
                  goto LAB_00109c41;
                }
                if (uVar23 == 0x7c200040) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x42];
                  goto LAB_00109c41;
                }
                if (uVar26 == 0x28000000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x45];
                  goto LAB_00109cb1;
                }
                if (uVar26 == 0x28200000) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x17);
                  pvVar18 = opcodes[0x44];
                  goto LAB_00109cb1;
                }
                if (uVar21 == 0x7c000034) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar19 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x47];
                  goto LAB_00109a8f;
                }
                if (uVar21 == 0x7c000035) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar19 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x46];
                  goto LAB_00109a8f;
                }
                if (uVar21 == 0x7c000074) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x49];
                  break;
                }
                if (uVar21 == 0x7c000075) {
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x48];
                  break;
                }
                switch((uVar16 + 0xb3ffffbe) * 0x4000000 | uVar16 + 0xb3ffffbe >> 6) {
                case 0:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4e];
                  break;
                default:
                  uVar23 = uVar3 & 0xffe007ff | uVar31;
                  if (uVar23 == 0x7c00006c) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x59];
LAB_0010a0a6:
                    bVar14 = (byte)(uVar37 >> 0xb);
                    *(void **)puVar12 = pvVar18;
                    goto LAB_00109a96;
                  }
                  if (uVar23 == 0x7c00007c) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x58];
                    goto LAB_0010a0a6;
                  }
                  if (uVar23 == 0x7c0000ac) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x55];
                    goto LAB_0010a0a6;
                  }
                  if (uVar23 == 0x7c0000bc) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x54];
                    goto LAB_0010a0a6;
                  }
                  if (uVar23 == 0x7c0005ec) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x53];
                    goto LAB_0010a0a6;
                  }
                  if (uVar23 == 0x7c0005fc) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x52];
                    goto LAB_0010a0a6;
                  }
                  if (uVar23 == 0x7c0003ac) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x57];
LAB_0010dc4c:
                    bVar19 = (byte)(uVar37 >> 0xb);
                    *(void **)puVar12 = pvVar18;
                    goto LAB_0010d807;
                  }
                  if (uVar23 == 0x7c0003bc) {
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    pvVar18 = opcodes[0x56];
                    goto LAB_0010dc4c;
                  }
                  switch((uVar16 + 0x83fffe14) * 0x10000000 | uVar16 + 0x83fffe14 >> 4) {
                  case 0:
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    bVar14 = (byte)(uVar37 >> 0x15);
                    pvVar18 = opcodes[0x5d];
                    break;
                  case 1:
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    bVar14 = (byte)(uVar37 >> 0x15);
                    pvVar18 = opcodes[0x5c];
                    break;
                  default:
                    if (uVar23 == 0x7c0007ec) {
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      pvVar18 = opcodes[0x5f];
                      goto LAB_0010dc4c;
                    }
                    if (uVar23 == 0x7c0007fc) {
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      pvVar18 = opcodes[0x5e];
                      goto LAB_0010dc4c;
                    }
                    switch(uVar16) {
                    case 0x7c000392:
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      bVar14 = (byte)(uVar37 >> 0xb);
                      bVar35 = (byte)(uVar37 >> 0x15);
                      pvVar18 = opcodes[0x67];
                      goto LAB_0010d734;
                    case 0x7c000393:
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      bVar14 = (byte)(uVar37 >> 0xb);
                      bVar35 = (byte)(uVar37 >> 0x15);
                      pvVar18 = opcodes[0x65];
                      goto LAB_0010d734;
                    case 0x7c000394:
                    case 0x7c000395:
switchD_0010a13f_caseD_7c0007d4:
                      if (uVar21 == 0x7c000734) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x75];
                        goto LAB_00109a8f;
                      }
                      if (uVar21 == 0x7c000735) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x74];
                        goto LAB_00109a8f;
                      }
                      if (uVar21 == 0x7c000774) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x73];
                        goto LAB_00109a8f;
                      }
                      if (uVar21 == 0x7c000775) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x72];
                        goto LAB_00109a8f;
                      }
                      if (uVar21 == 0x7c0007b4) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x77];
                        goto LAB_0010d801;
                      }
                      if (uVar21 == 0x7c0007b5) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x76];
                        goto LAB_0010d801;
                      }
                      uVar26 = uVar2 & 0x7fe;
                      bVar35 = (byte)(uVar17 >> 0x18);
                      bVar38 = 0xfbffffff < uVar37;
                      bVar25 = (uVar4 & 0x1f0000) == 0;
                      bVar33 = bVar25 && bVar38;
                      if ((uVar26 == 0x210 && (bVar25 && bVar38)) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x78];
LAB_0010a4c9:
                        *(void **)puVar12 = pvVar18;
                        puVar12[8] = bVar19 & 0x1f;
                        goto LAB_00109a9d;
                      }
                      if (((~(uVar26 == 0x210 && bVar33) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x79];
                        goto LAB_0010a4c9;
                      }
                      bVar39 = 0xdfffffff < uVar37;
                      bVar42 = (uVar31 & 0x1c000000) == 0x1c000000;
                      bVar34 = bVar42 && bVar39;
                      bVar6 = (uVar2 & 0x7c0) == 0;
                      uVar28 = uVar29 & 0x3e;
                      if (((uVar29 & 1) == 0) && (uVar28 == 0x2a && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x7a];
                        break;
                      }
                      bVar7 = (uVar2 & 0x7c0) == 0;
                      bVar40 = 0xdfffffff < uVar37;
                      bVar43 = (uVar31 & 0x1c000000) == 0xc000000;
                      bVar24 = bVar43 && bVar40;
                      bVar32 = bVar7 && bVar24;
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x2a && (bVar7 && (bVar43 && bVar40))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x7b];
                        break;
                      }
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x2a && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x7c];
                        break;
                      }
                      if (((~(uVar28 == 0x2a && bVar32) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x7d];
                        break;
                      }
                      if (bVar33 && (uVar29 | uVar27 & 0x7ff) == 0x69c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x7e];
                        goto LAB_0010ecfc;
                      }
                      bVar41 = 0xfbffffff < uVar37;
                      bVar9 = (uVar4 & 0x600000) == 0;
                      bVar5 = (uVar2 & 0x780) == 0;
                      if ((uVar29 & 0x7f) == 0x40 && (bVar5 && (bVar9 && bVar41))) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x17);
                        pvVar18 = opcodes[0x7f];
                        goto LAB_00109c41;
                      }
                      if ((uVar29 & 0x7f) == 0 && (bVar5 && (bVar9 && bVar41))) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x17);
                        pvVar18 = opcodes[0x80];
                        goto LAB_00109c41;
                      }
                      uVar27 = uVar2 & 0x7fc;
                      if ((((uVar29 & 1) == 0) && (uVar27 == 0x65c && (bVar25 && bVar38))) &&
                         ((uVar29 & 2) != 0)) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x81];
                        goto LAB_0010a4c9;
                      }
                      if ((uVar27 == 0x65c && (bVar25 && bVar38)) && (uVar29 & 3) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x82];
                        goto LAB_0010a4c9;
                      }
                      bVar5 = (uVar29 & 2) != 0;
                      bVar44 = uVar27 == 0x1c;
                      if (((uVar29 & 1) == 0) && ((bVar44 && (bVar25 && bVar38)) && bVar5)) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x83];
                        goto LAB_0010a4c9;
                      }
                      bVar30 = (uVar29 & 2) == 0 && (bVar44 && bVar33);
                      if (((uVar29 & 1) != 0) && (bVar30)) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x84];
                        goto LAB_0010a4c9;
                      }
                      if ((uVar29 & 1) != 0 && ((bVar44 && (bVar25 && bVar38)) && bVar5)) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x85];
                        goto LAB_0010a4c9;
                      }
                      if (((~bVar30 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x86];
                        goto LAB_0010a4c9;
                      }
                      if (((uVar29 & 1) == 0) && (uVar28 == 0x24 && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x87];
                        break;
                      }
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x24 && (bVar7 && (bVar43 && bVar40))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x88];
                        break;
                      }
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x24 && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x89];
                        break;
                      }
                      if (((~(uVar28 == 0x24 && bVar32) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8a];
                        break;
                      }
                      bVar25 = uVar28 == 0x3a && bVar34;
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8b];
LAB_0010afbb:
                        *(void **)puVar12 = pvVar18;
                        puVar12[8] = bVar14 & 0x1f;
LAB_0010affd:
                        puVar12[9] = bVar19 & 0x1f;
                        puVar12[10] = (byte)(uVar37 >> 0xb) & 0x1f;
                        puVar12[0xb] = (byte)(uVar37 >> 6) & 0x1f;
                        goto LAB_0010982b;
                      }
                      bVar38 = uVar28 == 0x3a && bVar24;
                      if (bVar38 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8c];
                        goto LAB_0010afbb;
                      }
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8d];
                        goto LAB_0010afbb;
                      }
                      if (((~bVar38 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8e];
                        goto LAB_0010afbb;
                      }
                      bVar25 = uVar26 == 0x90 && bVar33;
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x8f];
                        goto LAB_0010a4c9;
                      }
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x90];
                        goto LAB_0010a4c9;
                      }
                      bVar25 = uVar28 == 0x38 && bVar34;
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x91];
                        goto LAB_0010afbb;
                      }
                      bVar38 = uVar28 == 0x38 && bVar24;
                      if (bVar38 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x92];
                        goto LAB_0010afbb;
                      }
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x93];
                        goto LAB_0010afbb;
                      }
                      if (((~bVar38 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x94];
                        goto LAB_0010afbb;
                      }
                      bVar25 = (uVar2 & 0xf83e) == 0x32 && bVar34;
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x95];
LAB_0010accd:
                        *(void **)puVar12 = pvVar18;
                        puVar12[8] = bVar35 & 0x1f;
                        puVar12[9] = bVar19 & 0x1f;
                        goto LAB_00109828;
                      }
                      bVar38 = (uVar2 & 0xf83e) == 0x32 && bVar24;
                      if (bVar38 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x96];
                        goto LAB_0010accd;
                      }
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x97];
                        goto LAB_0010accd;
                      }
                      if (((~bVar38 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x98];
                        goto LAB_0010accd;
                      }
                      bVar25 = uVar26 == 0x110 && bVar33;
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x99];
                        goto LAB_0010a4c9;
                      }
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9a];
                        goto LAB_0010a4c9;
                      }
                      bVar25 = uVar26 == 0x50 && bVar33;
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9b];
                        goto LAB_0010a4c9;
                      }
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9c];
                        goto LAB_0010a4c9;
                      }
                      bVar25 = uVar28 == 0x3e && bVar34;
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9d];
                        goto LAB_0010afbb;
                      }
                      bVar38 = uVar28 == 0x3e && bVar24;
                      if (bVar38 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9e];
                        goto LAB_0010afbb;
                      }
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x9f];
                        goto LAB_0010afbb;
                      }
                      if (((~bVar38 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa0];
                        goto LAB_0010afbb;
                      }
                      bVar25 = uVar28 == 0x3c && bVar34;
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa1];
                        goto LAB_0010afbb;
                      }
                      bVar38 = uVar28 == 0x3c && bVar24;
                      if (bVar38 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa2];
                        goto LAB_0010afbb;
                      }
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa3];
LAB_0010aff2:
                        *(void **)puVar12 = pvVar18;
                        puVar12[8] = bVar14 & 0x1f;
                        goto LAB_0010affd;
                      }
                      if (((~bVar38 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa4];
                        goto LAB_0010aff2;
                      }
                      uVar27 = uVar37 & 0xfc1f07ff;
                      if (uVar27 == 0xec000030) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa6];
LAB_0010ecfc:
                        bVar19 = (byte)(uVar37 >> 0xb);
                        *(void **)puVar12 = pvVar18;
                        puVar12[0xc] = bVar14 & 0x1f;
                        goto LAB_0010d80d;
                      }
                      if (uVar27 == 0xec000031) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa5];
                        goto LAB_0010ecfc;
                      }
                      bVar25 = uVar26 == 0x18 && bVar33;
                      if (bVar25 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa7];
LAB_0010bbbc:
                        *(void **)puVar12 = pvVar18;
                        puVar12[8] = bVar19 & 0x1f;
                        goto LAB_00109a9d;
                      }
                      if (((~bVar25 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa8];
                        goto LAB_0010bbbc;
                      }
                      bVar33 = uVar26 == 0x34 && bVar33;
                      if (bVar33 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xa9];
                        goto LAB_0010ecfc;
                      }
                      if (((~bVar33 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xaa];
                        goto LAB_0010ecfc;
                      }
                      if ((uVar28 == 0x2e && 0xfbffffff < uVar37) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0xb);
                        bVar20 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xab];
                        goto LAB_0010f487;
                      }
                      if (((~(uVar28 == 0x2e && 0xfbffffff < uVar37) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 6);
                        bVar35 = (byte)(uVar37 >> 0xb);
                        bVar20 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xac];
                        goto LAB_0010f487;
                      }
                      bVar34 = (uVar3 & 0x1f07fe) == 0x2c && bVar34;
                      if (((~bVar34 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xad];
                        goto LAB_0010ecfc;
                      }
                      bVar24 = (uVar3 & 0x1f07fe) == 0x2c && bVar24;
                      if (bVar24 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xae];
                        goto LAB_0010ecfc;
                      }
                      if (bVar34 && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xaf];
                        goto LAB_0010ecfc;
                      }
                      if (((~bVar24 | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb0];
                        goto LAB_0010ecfc;
                      }
                      if (((uVar29 & 1) == 0) && (uVar28 == 0x28 && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb1];
                        goto LAB_0010d5c2;
                      }
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x28 && (bVar7 && (bVar43 && bVar40))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb2];
                        goto LAB_0010d5c2;
                      }
                      if (((uVar29 & 1) != 0) && (uVar28 == 0x28 && (bVar6 && (bVar42 && bVar39))))
                      {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb3];
                        goto LAB_0010d5c2;
                      }
                      if (((~(uVar28 == 0x28 && bVar32) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb4];
                        goto LAB_0010d5c2;
                      }
                      if (uVar23 == 0x7c0007ac) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        *(void **)puVar12 = opcodes[0xb5];
                        goto LAB_00109c4f;
                      }
                      if (uVar16 == 0x7c00002c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb6];
                        goto LAB_0010d5c2;
                      }
                      if (uVar17 == 0x2c01004c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,8);
                        pvVar18 = opcodes[0xb7];
                        goto LAB_0010d650;
                      }
                      uVar31 = uVar37 & 0xfc1f0000;
                      if (uVar31 == 0x8c000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb8];
                        goto LAB_0010bc49;
                      }
                      if (uVar8 == 0x8c000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xba];
LAB_0010d620:
                        *(void **)puVar12 = pvVar18;
                        bVar14 = bVar14 & 0x1f;
LAB_0010d626:
                        puVar12[10] = bVar14;
                        puVar12[0xb] = bVar19 & 0x1f;
LAB_0010d62f:
                        *(undefined2 *)(puVar12 + 8) = uVar36;
                        goto LAB_0010982b;
                      }
                      if (uVar8 == 0x88000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xb9];
                        goto LAB_0010d620;
                      }
                      uVar28 = uVar37 & 0xfc00000f;
                      if (uVar28 == 0xe8000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xbd];
LAB_0010f3f0:
                        *(void **)puVar12 = pvVar18;
                        puVar12[0xe] = bVar14 & 0x1f;
                        puVar12[0xf] = bVar19 & 0x1f;
                        uVar15 = (ushort)(uVar2 >> 4);
                        goto LAB_0010daed;
                      }
                      if (uVar28 == 0xe8000001) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xbc];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c0000ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xbe];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0000ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xbf];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c0000ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc0];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0000ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc1];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c0000be) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc3];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c0003be) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc4];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c0000fe) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc2];
                        goto LAB_0010d734;
                      }
                      if (uVar28 == 0xf8000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc6];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xf8000001) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc5];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c00063e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[200];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c00067e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[199];
                        goto LAB_0010d734;
                      }
                      if (uVar31 == 0xcc000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xc9];
LAB_0010bc49:
                        *(void **)puVar12 = pvVar18;
                        puVar12[10] = bVar19 & 0x1f;
                        goto LAB_0010d62f;
                      }
                      if (uVar8 == 0xcc000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xcb];
                        goto LAB_0010d620;
                      }
                      if (uVar8 == 0xc8000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xca];
                        goto LAB_0010d620;
                      }
                      if (uVar28 == 0xf8000006) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xce];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xf8000007) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xcd];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c0004ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xcf];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0004ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd0];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c0004ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd1];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0004ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd2];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c0004be) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd4];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c0004fe) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd3];
                        goto LAB_0010d734;
                      }
                      if (uVar31 == 0xc4000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd5];
                        goto LAB_0010bc49;
                      }
                      if (uVar8 == 0xc4000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd7];
                        goto LAB_0010d620;
                      }
                      if (uVar8 == 0xc0000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd6];
LAB_0010cfe9:
                        *(void **)puVar12 = pvVar18;
                        goto LAB_0010d626;
                      }
                      if (uVar28 == 0xf8000004) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xda];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xf8000005) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xd9];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c00042e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xdb];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c00046e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xdc];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00046e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xdd];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c00042e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xde];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00043e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe0];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c00047e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xdf];
                        goto LAB_0010d734;
                      }
                      if (uVar31 == 0xac000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe1];
                        goto LAB_0010bc49;
                      }
                      if (uVar8 == 0xac000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe3];
                        goto LAB_0010d620;
                      }
                      if (uVar8 == 0xa8000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe2];
                        goto LAB_0010d620;
                      }
                      if (uVar28 == 0xe8000004) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe6];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xe8000005) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe5];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c0002ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe7];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0002ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe8];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c0002ee) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xe9];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0002ae) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xea];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00062c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xed];
                        goto LAB_0010d5c2;
                      }
                      if (uVar16 == 0x7c0002be) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xec];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c0002fe) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xeb];
                        goto LAB_0010d734;
                      }
                      if (uVar27 == 0x7c00062c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xee];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00063c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xef];
                        goto LAB_0010d734;
                      }
                      if (uVar31 == 0xa4000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf0];
                        goto LAB_0010bc49;
                      }
                      if (uVar8 == 0xa4000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf2];
                        goto LAB_0010d620;
                      }
                      if (uVar8 == 0xa0000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf1];
                        goto LAB_0010cfe9;
                      }
                      if (uVar28 == 0xe8000002) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf5];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xe8000003) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf4];
                        goto LAB_0010f3f0;
                      }
                      if (uVar16 == 0x7c00022e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf6];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c00026e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf7];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00026e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf8];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c00022e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xf9];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00023e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xfb];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c00027e) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xfa];
                        goto LAB_0010d734;
                      }
                      if (uVar8 == 0xb8000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xfc];
                        goto LAB_0010d620;
                      }
                      if (uVar16 == 0x7c0004aa) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xfe];
                        goto LAB_0010d5c2;
                      }
                      if (uVar27 == 0x7c0004aa) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0xff];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c000028) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x101];
                        goto LAB_0010d5c2;
                      }
                      if (uVar16 == 0x7c00042c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x103];
                        goto LAB_0010d5c2;
                      }
                      if (uVar16 == 0x7c0000fc) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x102];
                        goto LAB_0010d734;
                      }
                      if (uVar16 == 0x7c00042a) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x100];
                        goto LAB_0010d734;
                      }
                      if (uVar27 == 0x7c00042c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x104];
                        goto LAB_0010bbbc;
                      }
                      if (uVar16 == 0x7c00043c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x105];
                        goto LAB_0010d734;
                      }
                      if (uVar31 == 0x84000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x106];
                        goto LAB_0010bc49;
                      }
                      if (uVar8 == 0x84000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x108];
                        goto LAB_0010d620;
                      }
                      if (uVar28 == 0xe8000006) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10b];
                        goto LAB_0010f3f0;
                      }
                      if (uVar28 == 0xe8000007) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10a];
                        goto LAB_0010f3f0;
                      }
                      switch((uVar16 + 0x83ffffd2) * 0x10000000 | uVar16 + 0x83ffffd2 >> 4) {
                      case 0:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10d];
                        goto LAB_0010d5c2;
                      case 1:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10f];
                        goto LAB_0010d734;
                      case 4:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10c];
                        goto LAB_0010d5c2;
                      case 5:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x10e];
                        goto LAB_0010d734;
                      }
                      uVar27 = uVar37 & 0xfc1fffff;
                      if (uVar27 == 0x7c0006ac) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x110];
                        goto LAB_0010c146;
                      }
                      if ((uVar37 & 0xfc63ffff) == 0x4c000000) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        *(void **)puVar12 = opcodes[0x111];
                        puVar12[8] = (byte)(uVar37 >> 0x17) & 7;
                        bVar14 = (byte)(uVar37 >> 0x12) & 7;
                        goto LAB_00109a9d;
                      }
                      if ((bVar9 && bVar41) && (uVar2 | uVar4 & 0x3ffff) == 0x80) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        *(void **)puVar12 = opcodes[0x112];
                        puVar12[0xc] = (byte)(uVar37 >> 0x17) & 7;
                        bVar19 = (byte)(uVar37 >> 0x12) & 7;
                        goto LAB_0010d80d;
                      }
                      if ((uVar37 & 0xfc7fffff) == 0x7c000440) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x114];
LAB_0010e100:
                        *(void **)puVar12 = pvVar18;
                        bVar19 = (byte)(uVar37 >> 0x17) & 7;
LAB_0010f271:
                        puVar12[0xc] = bVar19;
                        goto LAB_0010d74b;
                      }
                      if ((uVar37 & 0xfc7fffff) == 0x7c000400) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x113];
                        goto LAB_0010e100;
                      }
                      if (uVar21 == 0x7c000226) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x115];
                        goto LAB_0010d801;
                      }
                      if (uVar27 == 0x7c000026) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x116];
                        goto LAB_0010c146;
                      }
                      if (uVar16 == 0x7c000286) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x117];
                        goto LAB_0010f1a7;
                      }
                      bVar33 = (uVar3 & 0x1ff800) == 0;
                      bVar38 = 0xfbffffff < uVar37;
                      bVar25 = bVar38 && bVar33;
                      if ((uVar26 == 0x48e && (bVar38 && bVar33)) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x118];
LAB_0010c146:
                        *(void **)puVar12 = pvVar18;
                        bVar19 = bVar19 & 0x1f;
LAB_0010c14c:
                        puVar12[8] = bVar19;
                        goto LAB_0010982b;
                      }
                      if (((~(uVar26 == 0x48e && bVar25) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x119];
                        goto LAB_0010c146;
                      }
                      if (uVar27 == 0x7c0802a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x11b];
                        goto LAB_0010c146;
                      }
                      if (uVar27 == 0x7c0902a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x11c];
                        goto LAB_0010c146;
                      }
                      if (uVar27 == 0x7c0000a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x11a];
                        goto LAB_0010f26b;
                      }
                      if (uVar16 == 0x7c0002a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x11d];
LAB_0010f1a7:
                        *(void **)puVar12 = pvVar18;
                        puVar12[0xe] = bVar19 & 0x1f;
                        uVar15 = (ushort)((uVar3 & 0x1ff800) >> 0xb);
                        goto LAB_0010daed;
                      }
                      if (uVar17 == 0xac04007c) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,8);
                        pvVar18 = opcodes[0x11e];
                        goto LAB_0010d650;
                      }
                      if ((uVar37 & 0xfc100fff) == 0x7c000120) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0xc);
                        *(void **)puVar12 = opcodes[0x11f];
                        puVar12[9] = (byte)(uVar37 >> 0x15) & 0x1f;
                        goto LAB_0010c14c;
                      }
                      if (uVar16 == 0x7c000386) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x120];
                        goto LAB_0010f1a7;
                      }
                      if ((uVar26 == 0x8c && (bVar38 && bVar33)) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x121];
LAB_0010f26b:
                        *(void **)puVar12 = pvVar18;
                        bVar19 = (byte)(uVar37 >> 0x15) & 0x1f;
                        goto LAB_0010f271;
                      }
                      if (((~(uVar26 == 0x8c && bVar25) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x122];
                        goto LAB_0010f26b;
                      }
                      if ((uVar26 == 0x4c && (bVar38 && bVar33)) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x123];
                        goto LAB_0010f26b;
                      }
                      if (((~(uVar26 == 0x4c && bVar25) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x124];
                        goto LAB_0010f26b;
                      }
                      bVar25 = (uVar37 & 0x20107fe) == 0x58e;
                      if ((bVar25 && 0xfbffffff < uVar37) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x125];
                        bVar14 = (byte)(uVar37 >> 0x11);
                        goto LAB_0010dc4c;
                      }
                      if (((~(bVar25 && 0xfbffffff < uVar37) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x126];
                        bVar14 = (byte)(uVar37 >> 0x11);
                        goto LAB_0010dc4c;
                      }
                      bVar25 = (uVar3 & 0x7f0ffe) == 0x10c;
                      if ((bVar25 && 0xfbffffff < uVar37) && (uVar29 & 1) != 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x17);
                        pvVar18 = opcodes[0x127];
LAB_0010e39c:
                        bVar19 = (byte)(uVar37 >> 0xc);
                        *(void **)puVar12 = pvVar18;
                        puVar12[0xd] = bVar14 & 7;
                        goto LAB_0010f271;
                      }
                      if (((~(bVar25 && 0xfbffffff < uVar37) | bVar35) & 1) == 0) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x17);
                        pvVar18 = opcodes[0x128];
                        goto LAB_0010e39c;
                      }
                      if (uVar27 == 0x7c0803a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x12a];
                        goto LAB_0010c146;
                      }
                      if (uVar27 == 0x7c0903a6) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar19 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[299];
                        goto LAB_0010c146;
                      }
                      if (uVar27 == 0x7c000124) {
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        pvVar18 = opcodes[0x129];
                        goto LAB_0010f26b;
                      }
                      switch(uVar16) {
                      case 0x7c000012:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x130];
                        break;
                      case 0x7c000013:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x12f];
                        break;
                      case 0x7c000014:
                      case 0x7c000015:
switchD_0010c0e8_caseD_7c000094:
                        if (uVar8 == 0x1c000000) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x137];
                          goto LAB_0010d620;
                        }
                        if (uVar16 == 0x7c0001d6) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x13b];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0001d7) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x139];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0003b8) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x13d];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0003b9) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x13c];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0005d7) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x13a];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0005d6) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x138];
                          goto LAB_0010d5c2;
                        }
                        if (uVar21 == 0x7c0000d0) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x141];
LAB_0010d46a:
                          bVar19 = (byte)(uVar37 >> 0x15);
                          *(void **)puVar12 = pvVar18;
                          goto LAB_00109c4c;
                        }
                        if (uVar21 == 0x7c0000d1) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x13f];
                          goto LAB_0010d46a;
                        }
                        if (uVar21 == 0x7c0004d1) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x140];
                          goto LAB_0010d46a;
                        }
                        if (uVar21 == 0x7c0004d0) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x13e];
                          goto LAB_0010d46a;
                        }
                        if (uVar16 == 0x7c0000f8) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x143];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c000379) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x144];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c000338) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x147];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c000339) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x146];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c000378) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x145];
                          goto LAB_0010d5c2;
                        }
                        if (uVar16 == 0x7c0000f9) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x142];
                          goto LAB_0010d5c2;
                        }
                        if (uVar8 == 0x60000000) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x149];
                          goto LAB_0010cfe9;
                        }
                        if (uVar8 == 0x64000000) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x148];
                          goto LAB_0010d620;
                        }
                        if (uVar17 == 0x6400004c) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x14b];
LAB_0010f323:
                          *(void **)puVar12 = pvVar18;
LAB_0010d74b:
                          *(uint32_t *)(puVar12 + 8) = addr;
                          pVar45 = std::
                                   _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                   ::
                                   _M_emplace<unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                             ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                               *)&this->blocks,&blockAddr_local,&block);
                          puVar1 = *(uint8_t **)
                                    ((long)pVar45.first.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    + 0x10);
                          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                          ~_Vector_base(&block.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       );
                          return puVar1;
                        }
                        if (uVar17 == 0x6600004c) {
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          pvVar18 = opcodes[0x14a];
                          goto LAB_0010f323;
                        }
                        uVar29 = (uVar37 & 0xfc00003f) + 0x88000000;
                        switch(uVar29 >> 1 | (uint)((uVar29 & 1) != 0) << 0x1f) {
                        case 0:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x151];
                          break;
                        case 1:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x14f];
                          break;
                        case 2:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x157];
                          break;
                        case 3:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x155];
                          break;
                        case 4:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15b];
                          break;
                        case 5:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x159];
                          break;
                        case 6:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15f];
                          break;
                        case 7:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15d];
                          break;
                        case 8:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x14d];
                          break;
                        case 9:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x153];
                          break;
                        default:
                          uVar29 = uVar37 & 0xfc000001;
                          if (uVar29 == 0x50000000) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x161];
LAB_0010c74d:
                            *(void **)puVar12 = pvVar18;
                            puVar12[8] = bVar22 & 0x1f;
                            puVar12[9] = bVar19 & 0x1f;
                            puVar12[10] = bVar20 & 0x1f;
                            puVar12[0xb] = bVar14 & 0x1f;
                            puVar12[0xc] = bVar35 >> 1 & 0x1f;
                            goto LAB_0010982b;
                          }
                          if (uVar29 == 0x5c000001) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x164];
                            goto LAB_0010c74d;
                          }
                          if (uVar29 == 0x54000000) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x165];
                            goto LAB_0010c74d;
                          }
                          if (uVar29 == 0x54000001) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x163];
                            goto LAB_0010c74d;
                          }
                          if (uVar29 == 0x5c000000) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x162];
                            goto LAB_0010c74d;
                          }
                          if (uVar29 == 0x50000001) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 6);
                            bVar20 = (byte)(uVar37 >> 0xb);
                            bVar22 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x160];
                            goto LAB_0010c74d;
                          }
                          if (uVar17 == 0x2000044) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            pvVar18 = opcodes[0x166];
                            goto LAB_0010f323;
                          }
                          switch(uVar16) {
                          case 0x7c000670:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x16d];
                            goto LAB_0010d5c2;
                          case 0x7c000671:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x16f];
                            goto LAB_0010d5c2;
                          case 0x7c000672:
                          case 0x7c000673:
                          case 0x7c000675:
switchD_0010c813_caseD_7c000672:
                            if (uVar8 == 0x98000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x175];
                              goto LAB_0010d620;
                            }
                            if (uVar8 == 0x9c000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x174];
                              goto LAB_0010d620;
                            }
                            if (uVar28 == 0xe8000008) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x177];
                              goto LAB_0010f3f0;
                            }
                            if (uVar28 == 0xe8000009) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x176];
                              goto LAB_0010f3f0;
                            }
                            if (uVar16 == 0x7c0001ae) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x179];
                              goto LAB_0010d5c2;
                            }
                            if (uVar16 == 0x7c0001ee) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x178];
                              goto LAB_0010d5c2;
                            }
                            if (uVar16 == 0x7c0001be) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17b];
                              break;
                            }
                            if (uVar16 == 0x7c0001fe) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17a];
                              break;
                            }
                            if (uVar16 == 0x7c0003ff) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17c];
                              break;
                            }
                            if (uVar28 == 0xf8000008) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17e];
                              goto LAB_0010f3f0;
                            }
                            if (uVar28 == 0xf8000009) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17d];
                              goto LAB_0010f3f0;
                            }
                            if (uVar16 == 0x7c00073e) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x180];
                              break;
                            }
                            if (uVar16 == 0x7c00077e) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x17f];
                              break;
                            }
                            if (uVar8 == 0xd8000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x182];
                              goto LAB_0010d620;
                            }
                            if (uVar8 == 0xdc000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x181];
                              goto LAB_0010d620;
                            }
                            if (uVar28 == 0xf800000e) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x184];
                              goto LAB_0010f3f0;
                            }
                            if (uVar28 == 0xf800000f) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x183];
                              goto LAB_0010f3f0;
                            }
                            if (uVar16 == 0x7c0005ae) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x186];
                              goto LAB_0010d5c2;
                            }
                            if (uVar16 == 0x7c0005ee) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x185];
                              goto LAB_0010d5c2;
                            }
                            if (uVar16 == 0x7c0005be) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x188];
                              break;
                            }
                            if (uVar16 == 0x7c0005fe) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x187];
                              break;
                            }
                            if (uVar16 == 0x7c0007ae) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x189];
                              break;
                            }
                            if (uVar16 == 0x7c0007be) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x18a];
                              break;
                            }
                            if (uVar8 == 0xd0000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x18c];
                              goto LAB_0010d620;
                            }
                            if (uVar8 == 0xd4000000) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x18b];
                              goto LAB_0010d620;
                            }
                            if (uVar28 == 0xf800000c) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x18e];
                              goto LAB_0010f3f0;
                            }
                            if (uVar28 == 0xf800000d) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x18d];
                              goto LAB_0010f3f0;
                            }
                            switch((uVar16 + 0x83fffad2) * 0x10000000 | uVar16 + 0x83fffad2 >> 4) {
                            case 0:
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[400];
                              goto LAB_0010d5c2;
                            case 1:
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x192];
                              break;
                            default:
                              if (uVar8 == 0xb0000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x194];
                                goto LAB_0010d620;
                              }
                              if (uVar8 == 0xb4000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x193];
                                goto LAB_0010d620;
                              }
                              if (uVar28 == 0xe800000a) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x196];
                                goto LAB_0010f3f0;
                              }
                              if (uVar28 == 0xe800000b) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x195];
                                goto LAB_0010f3f0;
                              }
                              if (uVar16 == 0x7c00032e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x198];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00036e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x197];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00072c) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19b];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00033e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19a];
                                break;
                              }
                              if (uVar16 == 0x7c00037e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x199];
                                break;
                              }
                              if (uVar16 == 0x7c00073c) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19c];
                                break;
                              }
                              if (uVar8 == 0xbc000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19d];
                                goto LAB_0010d620;
                              }
                              if (uVar16 == 0x7c0005aa) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19e];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00052a) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x19f];
                                break;
                              }
                              if (uVar8 == 0x90000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a1];
                                goto LAB_0010d620;
                              }
                              if (uVar8 == 0x94000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a0];
                                goto LAB_0010d620;
                              }
                              if (uVar28 == 0xe800000e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a3];
                                goto LAB_0010f3f0;
                              }
                              if (uVar28 == 0xe800000f) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a2];
                                goto LAB_0010f3f0;
                              }
                              if (uVar16 == 0x7c000010) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b3];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000011) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b1];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000050) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1af];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000051) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ad];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000110) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b7];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000111) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b5];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00012d) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1aa];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00012e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a5];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00016e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a4];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000410) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b0];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000411) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b2];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000450) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ac];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000451) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ae];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000510) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b4];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c000511) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b6];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00052c) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a8];
                                goto LAB_0010d5c2;
                              }
                              if (uVar16 == 0x7c00013d) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ab];
                                break;
                              }
                              if (uVar16 == 0x7c00013e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a7];
                                break;
                              }
                              if (uVar16 == 0x7c00017e) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a6];
                                break;
                              }
                              if (uVar16 == 0x7c000310) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1bb];
                                break;
                              }
                              if (uVar16 == 0x7c000311) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b9];
                                break;
                              }
                              if (uVar16 == 0x7c00053c) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1a9];
                                break;
                              }
                              if (uVar16 == 0x7c000710) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1b8];
                                break;
                              }
                              if (uVar16 == 0x7c000711) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ba];
                                break;
                              }
                              if (uVar8 == 0x20000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1bc];
                                goto LAB_0010cfe9;
                              }
                              if (uVar21 == 0x7c000190) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1c8];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c000191) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1c6];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c0001d0) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1c0];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c0001d1) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1be];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c000590) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1c5];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c000591) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1c7];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c0005d0) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1bd];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c0005d1) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1bf];
                                goto LAB_0010d46a;
                              }
                              if (uVar21 == 0x7c000394) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1cc];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c000395) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ca];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c0003d0) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1c4];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c0003d1) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1c2];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c000794) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1c9];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c000795) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1cb];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c0007d0) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1c1];
                                goto LAB_0010d801;
                              }
                              if (uVar21 == 0x7c0007d1) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1c3];
                                goto LAB_0010d801;
                              }
                              if (uVar17 == 0xac04207c) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,8);
                                pvVar18 = opcodes[0x1cd];
LAB_0010d650:
                                *(void **)puVar12 = pvVar18;
                                goto LAB_0010982b;
                              }
                              if (uVar16 == 0x7c000088) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1ce];
                                break;
                              }
                              if (uVar8 == 0x8000000) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                *(void **)puVar12 = opcodes[0x1cf];
                                puVar12[0xe] = (byte)(uVar37 >> 0x15) & 0x1f;
                                puVar12[0xf] = bVar19 & 0x1f;
                                *(undefined2 *)(puVar12 + 0xc) = uVar36;
                                goto LAB_0010d74b;
                              }
                              if (uVar23 == 0x7c000624) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1d1];
                                goto LAB_0010dc4c;
                              }
                              if (uVar23 == 0x7c000626) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                pvVar18 = opcodes[0x1d0];
                                goto LAB_0010dc4c;
                              }
                              switch(uVar16) {
                              case 0x7c000724:
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1d6];
                                break;
                              case 0x7c000725:
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1d4];
                                break;
                              case 0x7c000726:
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1d3];
                                break;
                              case 0x7c000727:
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar14 = (byte)(uVar37 >> 0xb);
                                bVar35 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[0x1d5];
                                break;
                              default:
                                if (uVar16 == 0x7c000764) {
                                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                      (&allocOpcode,0x10);
                                  pvVar18 = opcodes[0x1d2];
LAB_0010f39b:
                                  *(void **)puVar12 = pvVar18;
                                  uVar15 = (ushort)(uVar37 >> 0xb) & 0x7fff;
                                  goto LAB_0010daed;
                                }
                                if (uVar17 == 0x6c02007c) {
                                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                      (&allocOpcode,0x10);
                                  pvVar18 = opcodes[0x1d7];
                                }
                                else {
                                  if (uVar16 == 0x7c000008) {
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    *(void **)puVar12 = opcodes[0x1d9];
                                    puVar12[9] = (byte)(uVar37 >> 0x15) & 0x1f;
                                    puVar12[8] = (byte)(uVar37 >> 0xf) & 0x3f;
                                    bVar14 = (byte)(uVar37 >> 0xb) & 0xf;
                                    goto LAB_00109828;
                                  }
                                  if (uVar16 == 0x7c0007a4) {
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    pvVar18 = opcodes[0x1d8];
                                    goto LAB_0010f39b;
                                  }
                                  if (uVar8 == 0xc000000) {
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    bVar14 = (byte)(uVar37 >> 0x15);
                                    pvVar18 = opcodes[0x1da];
                                    goto LAB_0010d620;
                                  }
                                  if (uVar27 == 0x7c000106) {
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    pvVar18 = opcodes[0x1db];
                                    goto LAB_0010f26b;
                                  }
                                  if (uVar17 == 0x4601007c) {
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    pvVar18 = opcodes[0x1dd];
                                  }
                                  else {
                                    if (uVar17 != 0x4681007c) {
                                      if (uVar16 == 0x7c000278) {
                                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                            (&allocOpcode,0x10);
                                        bVar14 = (byte)(uVar37 >> 0x15);
                                        pvVar18 = opcodes[0x1df];
                                      }
                                      else {
                                        if (uVar16 != 0x7c000279) {
                                          if (uVar8 == 0x68000000) {
                                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::
                                                      operator()(&allocOpcode,0x10);
                                            bVar14 = (byte)(uVar37 >> 0x15);
                                            pvVar18 = opcodes[0x1e1];
                                          }
                                          else {
                                            if (uVar8 != 0x6c000000) {
                                              if (uVar17 == 0x18) {
                                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::
                                                          operator()(&allocOpcode,8);
                                                pvVar18 = opcodes[0x1e2];
                                                goto LAB_0010d650;
                                              }
                                              poVar13 = std::operator<<((ostream *)&std::cerr,
                                                                        "Unimplemented instruction "
                                                                       );
                                              *(uint *)(poVar13 +
                                                       *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
                                                   *(uint *)(poVar13 +
                                                            *(long *)(*(long *)poVar13 + -0x18) +
                                                            0x18) & 0xffffffb5 | 8;
                                              poVar13 = std::ostream::_M_insert<unsigned_long>
                                                                  ((ulong)poVar13);
                                              std::endl<char,std::char_traits<char>>(poVar13);
                                              unimplemented(this,"unknown during translation",addr);
                                              goto LAB_0010982b;
                                            }
                                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::
                                                      operator()(&allocOpcode,0x10);
                                            bVar14 = (byte)(uVar37 >> 0x15);
                                            pvVar18 = opcodes[0x1e0];
                                          }
                                          goto LAB_0010d620;
                                        }
                                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                            (&allocOpcode,0x10);
                                        bVar14 = (byte)(uVar37 >> 0x15);
                                        pvVar18 = opcodes[0x1de];
                                      }
                                      goto LAB_0010d5c2;
                                    }
                                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                        (&allocOpcode,0x10);
                                    pvVar18 = opcodes[0x1dc];
                                  }
                                }
                                goto LAB_0010f323;
                              }
                              break;
                            case 4:
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[399];
                              goto LAB_0010d5c2;
                            case 5:
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0xb);
                              bVar35 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x191];
                            }
                            break;
                          case 0x7c000674:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x16c];
                            break;
                          case 0x7c000676:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x16b];
                            break;
                          default:
                            if (uVar16 == 0x7c000030) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x169];
                            }
                            else if (uVar16 == 0x7c000031) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x168];
                            }
                            else if (uVar16 == 0x7c000430) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x173];
                            }
                            else if (uVar16 == 0x7c000431) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x172];
                            }
                            else if (uVar16 == 0x7c000630) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x170];
                            }
                            else {
                              if (uVar16 != 0x7c000631) {
                                if (uVar16 == 0x7c000634) {
                                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                      (&allocOpcode,0x10);
                                  bVar14 = (byte)(uVar37 >> 0xb);
                                  bVar35 = (byte)(uVar37 >> 0x15);
                                  pvVar18 = opcodes[0x16a];
                                }
                                else if (uVar16 == 0x7c000436) {
                                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                      (&allocOpcode,0x10);
                                  bVar14 = (byte)(uVar37 >> 0xb);
                                  bVar35 = (byte)(uVar37 >> 0x15);
                                  pvVar18 = opcodes[0x171];
                                }
                                else {
                                  if (uVar16 != 0x7c000036) goto switchD_0010c813_caseD_7c000672;
                                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                      (&allocOpcode,0x10);
                                  bVar14 = (byte)(uVar37 >> 0xb);
                                  bVar35 = (byte)(uVar37 >> 0x15);
                                  pvVar18 = opcodes[0x167];
                                }
                                break;
                              }
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x16e];
                            }
LAB_0010d5c2:
                            *(void **)puVar12 = pvVar18;
                            puVar12[8] = bVar14 & 0x1f;
                            goto LAB_0010981f;
                          }
                          goto LAB_0010d734;
                        case 0x10:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x14e];
                          break;
                        case 0x11:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x150];
                          break;
                        case 0x12:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x154];
                          break;
                        case 0x13:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x156];
                          break;
                        case 0x14:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x158];
                          break;
                        case 0x15:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15a];
                          break;
                        case 0x16:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15c];
                          break;
                        case 0x17:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x15e];
                          break;
                        case 0x18:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x14c];
                          break;
                        case 0x19:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 6);
                          bVar35 = (byte)(uVar37 >> 0xb);
                          bVar20 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x152];
                        }
LAB_0010f487:
                        *(void **)puVar12 = pvVar18;
                        puVar12[0xc] = bVar20 & 0x1f;
                        puVar12[0xd] = bVar19 & 0x1f;
                        puVar12[0xe] = bVar35 & 0x1f;
                        puVar12[0xf] = bVar14 & 0x1f;
                        goto LAB_0010d74b;
                      case 0x7c000016:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x134];
                        goto LAB_0010d5c2;
                      case 0x7c000017:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x133];
                        goto LAB_0010d5c2;
                      default:
                        switch(uVar16) {
                        case 0x7c000092:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0xb);
                          bVar35 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x12e];
                          break;
                        case 0x7c000093:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0xb);
                          bVar35 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x12d];
                          break;
                        case 0x7c000094:
                        case 0x7c000095:
                          goto switchD_0010c0e8_caseD_7c000094;
                        case 0x7c000096:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x132];
                          goto LAB_0010d5c2;
                        case 0x7c000097:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x131];
                          goto LAB_0010d5c2;
                        default:
                          if (uVar16 == 0x7c0001d2) {
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x136];
                          }
                          else {
                            if (uVar16 != 0x7c0005d2) {
                              if (uVar16 == 0x7c0003a6) {
                                puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                    (&allocOpcode,0x10);
                                bVar19 = (byte)(uVar37 >> 0x15);
                                pvVar18 = opcodes[300];
                                goto LAB_0010f1a7;
                              }
                              goto switchD_0010c0e8_caseD_7c000094;
                            }
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x135];
                          }
                        }
                      }
LAB_0010d734:
                      *(void **)puVar12 = pvVar18;
                      puVar12[0xc] = bVar35 & 0x1f;
                      puVar12[0xd] = bVar19 & 0x1f;
                      puVar12[0xe] = bVar14 & 0x1f;
                      goto LAB_0010d74b;
                    case 0x7c000396:
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      bVar14 = (byte)(uVar37 >> 0x15);
                      pvVar18 = opcodes[0x6f];
                      break;
                    case 0x7c000397:
                      puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                      bVar14 = (byte)(uVar37 >> 0x15);
                      pvVar18 = opcodes[0x6d];
                      break;
                    default:
                      switch(uVar16) {
                      case 0x7c0003d2:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[99];
                        goto LAB_0010d734;
                      case 0x7c0003d3:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0xb);
                        bVar35 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x61];
                        goto LAB_0010d734;
                      case 0x7c0003d4:
                      case 0x7c0003d5:
                        goto switchD_0010a13f_caseD_7c0007d4;
                      case 0x7c0003d6:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x6b];
                        break;
                      case 0x7c0003d7:
                        puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10)
                        ;
                        bVar14 = (byte)(uVar37 >> 0x15);
                        pvVar18 = opcodes[0x69];
                        break;
                      default:
                        switch(uVar16) {
                        case 0x7c000792:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0xb);
                          bVar35 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[100];
                          goto LAB_0010d734;
                        case 0x7c000793:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0xb);
                          bVar35 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x66];
                          goto LAB_0010d734;
                        case 0x7c000794:
                        case 0x7c000795:
                          goto switchD_0010a13f_caseD_7c0007d4;
                        case 0x7c000796:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x6c];
                          break;
                        case 0x7c000797:
                          puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                              (&allocOpcode,0x10);
                          bVar14 = (byte)(uVar37 >> 0x15);
                          pvVar18 = opcodes[0x6e];
                          break;
                        default:
                          switch(uVar16) {
                          case 0x7c0007d2:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x60];
                            goto LAB_0010d734;
                          case 0x7c0007d3:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0xb);
                            bVar35 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x62];
                            goto LAB_0010d734;
                          case 0x7c0007d4:
                          case 0x7c0007d5:
                            goto switchD_0010a13f_caseD_7c0007d4;
                          case 0x7c0007d6:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x68];
                            break;
                          case 0x7c0007d7:
                            puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                (&allocOpcode,0x10);
                            bVar14 = (byte)(uVar37 >> 0x15);
                            pvVar18 = opcodes[0x6a];
                            break;
                          default:
                            if (uVar16 == 0x7c000238) {
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x71];
                            }
                            else {
                              if (uVar16 != 0x7c000239) goto switchD_0010a13f_caseD_7c0007d4;
                              puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()
                                                  (&allocOpcode,0x10);
                              bVar14 = (byte)(uVar37 >> 0x15);
                              pvVar18 = opcodes[0x70];
                            }
                          }
                        }
                      }
                    }
                    break;
                  case 4:
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    bVar14 = (byte)(uVar37 >> 0x15);
                    pvVar18 = opcodes[0x5b];
                    break;
                  case 5:
                    puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                    bVar14 = (byte)(uVar37 >> 0x15);
                    pvVar18 = opcodes[0x5a];
                  }
                  break;
                case 3:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4b];
                  break;
                case 5:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x51];
                  break;
                case 6:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4d];
                  break;
                case 7:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4a];
                  break;
                case 8:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4c];
                  break;
                case 0xc:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x50];
                  break;
                case 0xd:
                  puVar12 = fetchBlock::anon_class_8_1_a7b1b3ad::operator()(&allocOpcode,0x10);
                  bVar14 = (byte)(uVar37 >> 0x15);
                  pvVar18 = opcodes[0x4f];
                }
LAB_00109814:
                *(void **)puVar12 = pvVar18;
                puVar12[8] = bVar14 & 0x1f;
LAB_0010981f:
                puVar12[9] = bVar19 & 0x1f;
                bVar14 = (byte)(uVar37 >> 0xb) & 0x1f;
LAB_00109828:
                puVar12[10] = bVar14;
                goto LAB_0010982b;
              }
            }
LAB_0010d801:
            *(void **)puVar12 = pvVar18;
            bVar14 = bVar14 & 0x1f;
LAB_0010d807:
            puVar12[0xc] = bVar14;
            bVar19 = bVar19 & 0x1f;
LAB_0010d80d:
            puVar12[0xd] = bVar19;
            goto LAB_0010d74b;
          }
        }
        *(void **)puVar12 = pvVar18;
        *(uint *)(puVar12 + 0xc) = uVar17;
        goto LAB_0010d74b;
      }
      *(void **)puVar12 = pvVar18;
      goto LAB_0010dadd;
    }
    *(void **)puVar12 = pvVar18;
    bVar14 = bVar14 & 0x1f;
LAB_0010dadd:
    puVar12[0xe] = bVar14;
    puVar12[0xf] = bVar19 & 0x1f;
    uVar15 = (ushort)(uVar2 >> 2);
LAB_0010daed:
    *(ushort *)(puVar12 + 0xc) = uVar15;
    goto LAB_0010d74b;
  }
  *(void **)puVar12 = pvVar18;
  puVar12[10] = bVar14 & 0x1f;
  puVar12[0xb] = bVar19 & 0x1f;
LAB_001098a1:
  *(undefined2 *)(puVar12 + 8) = uVar36;
LAB_0010982b:
  addr = addr + 4;
  goto LAB_00109521;
}

Assistant:

uint8_t *PowerCore::fetchBlock(uint32_t blockAddr)
{
    auto it = blocks.find(blockAddr);
    if(it != blocks.end())
    {
        //std::cout << "Again at " << std::hex << blockAddr << std::endl;
        return it->second.data();
    }
    std::vector<uint8_t> block;

    //std::cout << "First time at " << std::hex << blockAddr << std::endl;

    auto allocOpcode = [&](unsigned sz) {
        block.resize(block.size() + sz);
        return block.data() + block.size() - sz;
    };

    uint32_t breakpoint = 0xFFFFFFFF;
    if(getNextBreakpoint)
        breakpoint = getNextBreakpoint(blockAddr);

    void ** opcodes;
    interpret2(&opcodes);
    auto makeOpcode = [opcodes](int idx) { return opcodes[idx]; };

    uint32_t addr = blockAddr;
    for(;;)
    {
        if(addr == breakpoint)
        {
            Opcode_breakpoint& translated = *reinterpret_cast<Opcode_breakpoint*>(allocOpcode(sizeof(Opcode_breakpoint)));
            translated.opcode = makeOpcode(-1);
            translated.CIA = addr;
            breakpoint = getNextBreakpoint(addr + 4);
        }
        uint32_t insn = load<uint32_t>(addr);
        if(false)
            ;
#include "generated.translate.h"
        else
        {
            std::cerr << "Unimplemented instruction " << std::hex << insn << std::endl;
            unimplemented("unknown during translation", addr);
        }
        addr += 4;
    }